

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

void __thiscall
lzham::vector<lzham::symbol_codec::output_symbol>::clear
          (vector<lzham::symbol_codec::output_symbol> *this)

{
  output_symbol *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  if (*in_RDI != (output_symbol)0x0) {
    scalar_type<lzham::symbol_codec::output_symbol>::destruct_array
              (in_RDI,in_stack_ffffffffffffffec);
    lzham_free((void *)0x1391e6);
    in_RDI->m_bits = 0;
    in_RDI->m_num_bits = 0;
    in_RDI->m_arith_prob0 = 0;
    in_RDI[1].m_bits = 0;
    in_RDI[1].m_num_bits = 0;
    in_RDI[1].m_arith_prob0 = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            lzham_free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }